

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageMipmaps(Image *image)

{
  bool bVar1;
  bool bVar2;
  Image image_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  undefined8 unaff_RBX;
  uint uVar9;
  undefined8 unaff_R12;
  int height;
  uint uVar10;
  undefined8 unaff_R13;
  int width;
  Image imCopy;
  Image local_48;
  
  pvVar7 = image->data;
  if (((pvVar7 != (void *)0x0) && (iVar6 = image->width, iVar6 != 0)) &&
     (iVar8 = image->height, iVar8 != 0)) {
    iVar5 = image->format;
    iVar3 = GetPixelDataSize(iVar6,iVar8,iVar5);
    uVar9 = 1;
    if (iVar8 != 1 || iVar6 != 1) {
      do {
        width = iVar6 / 2;
        if (width < 2) {
          width = 1;
        }
        height = iVar8 / 2;
        if (height < 2) {
          height = 1;
        }
        uVar9 = uVar9 + 1;
        iVar4 = GetPixelDataSize(width,height,iVar5);
        iVar3 = iVar3 + iVar4;
        bVar1 = 3 < iVar6;
        bVar2 = 3 < iVar8;
        iVar6 = width;
        iVar8 = height;
      } while (bVar2 || bVar1);
    }
    if ((int)uVar9 <= image->mipmaps) {
      TraceLog(4,"IMAGE: Mipmaps already available");
      return;
    }
    pvVar7 = realloc(pvVar7,(long)iVar3);
    if (pvVar7 == (void *)0x0) {
      TraceLog(4,"IMAGE: Mipmaps required memory could not be allocated");
    }
    else {
      image->data = pvVar7;
    }
    pvVar7 = image->data;
    iVar6 = image->width;
    iVar8 = image->height;
    iVar5 = image->format;
    image_00.width = (int)unaff_R12;
    image_00.height = (int)((ulong)unaff_R12 >> 0x20);
    image_00.data = (void *)unaff_RBX;
    image_00.mipmaps = (int)unaff_R13;
    image_00.format = (int)((ulong)unaff_R13 >> 0x20);
    ImageCopy(image_00);
    if (1 < uVar9) {
      iVar5 = GetPixelDataSize(iVar6,iVar8,iVar5);
      uVar10 = 1;
      do {
        pvVar7 = (void *)((long)iVar5 + (long)pvVar7);
        iVar6 = iVar6 / 2;
        iVar8 = iVar8 / 2;
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        iVar5 = GetPixelDataSize(iVar6,iVar8,image->format);
        if (image->mipmaps <= (int)uVar10) {
          ImageResize(&local_48,iVar6,iVar8);
          memcpy(pvVar7,local_48.data,(long)iVar5);
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    free(local_48.data);
    image->mipmaps = uVar9;
  }
  return;
}

Assistant:

void ImageMipmaps(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    int mipCount = 1;                   // Required mipmap levels count (including base level)
    int mipWidth = image->width;        // Base image width
    int mipHeight = image->height;      // Base image height
    int mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);  // Image data size (in bytes)

    // Count mipmap levels required
    while ((mipWidth != 1) || (mipHeight != 1))
    {
        if (mipWidth != 1) mipWidth /= 2;
        if (mipHeight != 1) mipHeight /= 2;

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;

        TRACELOGD("IMAGE: Next mipmap level: %i x %i - current size %i", mipWidth, mipHeight, mipSize);

        mipCount++;
        mipSize += GetPixelDataSize(mipWidth, mipHeight, image->format);       // Add mipmap size (in bytes)
    }

    if (image->mipmaps < mipCount)
    {
        void *temp = RL_REALLOC(image->data, mipSize);

        if (temp != NULL) image->data = temp;      // Assign new pointer (new size) to store mipmaps data
        else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps required memory could not be allocated");

        // Pointer to allocated memory point where store next mipmap level data
        unsigned char *nextmip = image->data;

        mipWidth = image->width;
        mipHeight = image->height;
        mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        Image imCopy = ImageCopy(*image);

        for (int i = 1; i < mipCount; i++)
        {
            nextmip += mipSize;

            mipWidth /= 2;
            mipHeight /= 2;

            // Security check for NPOT textures
            if (mipWidth < 1) mipWidth = 1;
            if (mipHeight < 1) mipHeight = 1;

            mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);

            if (i < image->mipmaps) continue;

            TRACELOGD("IMAGE: Generating mipmap level: %i (%i x %i) - size: %i - offset: 0x%x", i, mipWidth, mipHeight, mipSize, nextmip);

            ImageResize(&imCopy, mipWidth, mipHeight); // Uses internally Mitchell cubic downscale filter

            memcpy(nextmip, imCopy.data, mipSize);
        }

        UnloadImage(imCopy);

        image->mipmaps = mipCount;
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps already available");
}